

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O2

int genHouseTower(PieceEnv *env,Piece *current,int depth)

{
  byte bVar1;
  int iVar2;
  Piece *pPVar3;
  uint rot;
  
  iVar2 = 0;
  if (depth < 9) {
    bVar1 = current->rot;
    rot = (uint)bVar1;
    pPVar3 = addEndCityPiece(env,current,rot,-3,env->y,-0xb,0);
    iVar2 = nextInt(env->rng,3);
    if (iVar2 == 0) {
      addEndCityPiece(env,pPVar3,(uint)bVar1,-1,4,-1,1);
    }
    else {
      pPVar3 = addEndCityPiece(env,pPVar3,rot,-1,0,-1,10);
      if (iVar2 == 1) {
        iVar2 = 0xb;
      }
      else {
        pPVar3 = addEndCityPiece(env,pPVar3,rot,-1,4,-1,0xe);
        iVar2 = 0xf;
      }
      pPVar3 = addEndCityPiece(env,pPVar3,rot,-1,8,-1,iVar2);
      genPiecesRecusively(genTower,env,pPVar3,depth + 1);
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static
int genHouseTower(PieceEnv *env, Piece *current, int depth)
{
    if (depth > 8) return 0;
    int rot = current->rot;
    Piece *base = current;
    base = addEndCityPiece(env, base, rot, -3, env->y, -11, BASE_FLOOR);
    int size = nextInt(env->rng, 3);
    if (size == 0)
    {
        addEndCityPiece(env, base, rot, -1, 4, -1, BASE_ROOF);
        return 1;
    }
    base = addEndCityPiece(env, base, rot, -1, 0, -1, SECOND_FLOOR_2);
    if (size == 1)
    {
        base = addEndCityPiece(env, base, rot, -1, 8, -1, SECOND_ROOF);
    }
    else
    {
        base = addEndCityPiece(env, base, rot, -1, 4, -1, THIRD_FLOOR_2);
        base = addEndCityPiece(env, base, rot, -1, 8, -1, THIRD_ROOF);
    }
    genPiecesRecusively(genTower, env, base, depth+1);
    return 1;
}